

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O3

bool __thiscall HACD::ICHUll::CleanVertices(ICHUll *this,unsigned_long *addedPoints)

{
  CircularListElement<HACD::TMMEdge> *pCVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  byte bVar3;
  size_t sVar4;
  CircularListElement<HACD::TMMEdge> **ppCVar5;
  CircularListElement<HACD::TMMVertex> *element;
  CircularListElement<HACD::TMMVertex> *pCVar6;
  
  sVar4 = (this->m_mesh).m_edges.m_size;
  if (sVar4 != 0) {
    ppCVar5 = &(this->m_mesh).m_edges.m_head;
    do {
      pCVar1 = *ppCVar5;
      ((pCVar1->m_data).m_vertices[0]->m_data).m_onHull = true;
      ppCVar5 = &pCVar1->m_next;
      sVar4 = sVar4 - 1;
      ((pCVar1->m_data).m_vertices[1]->m_data).m_onHull = true;
    } while (sVar4 != 0);
  }
  pCVar2 = (this->m_mesh).m_vertices.m_head;
  element = pCVar2->m_prev;
  bVar3 = (element->m_data).m_tag;
  do {
    if (((bVar3 & 1) == 0) || ((element->m_data).m_onHull != false)) {
      (element->m_data).m_duplicate = (CircularListElement<HACD::TMMEdge> *)0x0;
      (element->m_data).m_onHull = false;
      pCVar6 = element->m_prev;
    }
    else {
      pCVar6 = element->m_prev;
      CircularList<HACD::TMMVertex>::Delete(&(this->m_mesh).m_vertices,element);
      *addedPoints = *addedPoints - 1;
    }
  } while ((pCVar6 != pCVar2) &&
          (bVar3 = (pCVar6->m_data).m_tag, element = pCVar6, (bool)bVar3 != false));
  return true;
}

Assistant:

bool ICHUll::CleanVertices(unsigned long & addedPoints)
    {
        // mark all vertices incident to some undeleted edge as on the hull
        CircularList<TMMEdge> & edges = m_mesh.GetEdges();
        CircularListElement<TMMEdge> * e = edges.GetHead();
        size_t nE = edges.GetSize();
        for(size_t i = 0; i < nE; i++)
        {
            e->GetData().m_vertices[0]->GetData().m_onHull = true;
            e->GetData().m_vertices[1]->GetData().m_onHull = true;
            e = e->GetNext();
        }
        // delete all the vertices that have been processed but are not on the hull
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * vHead = vertices.GetHead();
        CircularListElement<TMMVertex> * v = vHead;
        v = v->GetPrev();
        do 
        {
            if (v->GetData().m_tag && !v->GetData().m_onHull)
            {
                CircularListElement<TMMVertex> * tmp = v->GetPrev();
                vertices.Delete(v);
                v = tmp;
                addedPoints--;
            }
            else
            {
                v->GetData().m_duplicate = 0;
                v->GetData().m_onHull = false;
                v = v->GetPrev();
            }
        } 
        while (v->GetData().m_tag && v != vHead);
        return true;
    }